

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int get_entry_symlink(archive_write *a,archive_entry *entry,char **name,size_t *length,
                     archive_string_conv *sc)

{
  wchar_t wVar1;
  int *piVar2;
  int r;
  archive_string_conv *sc_local;
  size_t *length_local;
  char **name_local;
  archive_entry *entry_local;
  archive_write *a_local;
  
  wVar1 = _archive_entry_symlink_l(entry,name,length,sc);
  if (wVar1 == L'\0') {
    a_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
      a_local._4_4_ = -0x1e;
    }
    else {
      a_local._4_4_ = -0x14;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
get_entry_symlink(struct archive_write *a, struct archive_entry *entry,
    const char **name, size_t *length, struct archive_string_conv *sc)
{
	int r;

	r = archive_entry_symlink_l(entry, name, length, sc);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}